

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O0

void __thiscall QtMWidgets::Picker::paintEvent(Picker *this,QPaintEvent *param_1)

{
  QAbstractItemModel *pQVar1;
  bool bVar2;
  int offset_00;
  byte bVar3;
  int iVar4;
  int iVar5;
  QPalette *this_00;
  QColor *baseColor;
  PickerPrivate *pPVar6;
  PickerPrivate *pPVar7;
  QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
  *pQVar8;
  QModelIndex local_e8;
  QModelIndex local_d0;
  int local_b4;
  int local_b0;
  int scanedItems;
  int itemsCount;
  int i;
  int offset;
  int maxCount;
  QModelIndex local_88;
  QPainter local_70 [8];
  QPainter p;
  QStyleOption local_58 [8];
  QStyleOption opt;
  QRect local_48 [3];
  QPaintEvent *local_18;
  QPaintEvent *param_1_local;
  Picker *this_local;
  
  local_18 = param_1;
  param_1_local = (QPaintEvent *)this;
  QStyleOption::QStyleOption(local_58,1,0);
  QStyleOption::initFrom((QWidget *)local_58);
  QPainter::QPainter(local_70,(QPaintDevice *)&this->field_0x10);
  this_00 = (QPalette *)QWidget::palette();
  baseColor = QPalette::color(this_00,Dark);
  drawCylinder(local_70,local_48,baseColor,true,true);
  iVar4 = count(this);
  if (0 < iVar4) {
    QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>::
    operator->(&this->d);
    bVar3 = QPersistentModelIndex::isValid();
    if ((bVar3 & 1) == 0) {
      pQVar8 = &this->d;
      pPVar6 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
               ::operator->(pQVar8);
      pQVar1 = pPVar6->model;
      pPVar6 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
               ::operator->(pQVar8);
      iVar4 = pPVar6->modelColumn;
      pPVar6 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
               ::operator->(pQVar8);
      QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&offset,&pPVar6->root);
      (**(code **)(*(long *)pQVar1 + 0x60))(&local_88,pQVar1,0,iVar4,&offset);
      pPVar6 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
               ::operator->(&this->d);
      QPersistentModelIndex::operator=(&pPVar6->topItemIndex,&local_88);
      pPVar6 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
               ::operator->(&this->d);
      pPVar6->drawItemOffset = 0;
    }
    pPVar6 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
             ::operator->(&this->d);
    PickerPrivate::initDrawOffsetForFirstUse(pPVar6);
    pPVar6 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
             ::operator->(&this->d);
    PickerPrivate::normalizeOffset(pPVar6);
    pPVar6 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
             ::operator->(&this->d);
    i = pPVar6->itemsCount;
    iVar4 = count(this);
    pPVar6 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
             ::operator->(&this->d);
    if (pPVar6->itemsCount <= iVar4) {
      i = i + 1;
    }
    pPVar6 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
             ::operator->(&this->d);
    itemsCount = pPVar6->drawItemOffset;
    QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>::
    operator->(&this->d);
    scanedItems = QPersistentModelIndex::row();
    local_b0 = 0;
    local_b4 = 0;
    while( true ) {
      iVar4 = local_b4;
      bVar2 = false;
      if (local_b0 < i) {
        iVar5 = count(this);
        bVar2 = iVar4 < iVar5;
      }
      iVar4 = scanedItems;
      if (!bVar2) break;
      iVar5 = count(this);
      if (iVar4 == iVar5) {
        scanedItems = 0;
      }
      pQVar8 = &this->d;
      pPVar6 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
               ::operator->(pQVar8);
      offset_00 = itemsCount;
      pPVar7 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
               ::operator->(pQVar8);
      iVar5 = scanedItems;
      pQVar1 = pPVar7->model;
      pPVar7 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
               ::operator->(pQVar8);
      iVar4 = pPVar7->modelColumn;
      pPVar7 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
               ::operator->(pQVar8);
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_e8,&pPVar7->root);
      (**(code **)(*(long *)pQVar1 + 0x60))(&local_d0,pQVar1,iVar5,iVar4,&local_e8);
      PickerPrivate::drawItem(pPVar6,local_70,local_58,offset_00,&local_d0);
      pPVar6 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
               ::operator->(&this->d);
      iVar4 = pPVar6->itemTopMargin;
      pPVar6 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
               ::operator->(&this->d);
      itemsCount = iVar4 + pPVar6->stringHeight + itemsCount;
      scanedItems = scanedItems + 1;
      local_b4 = local_b4 + 1;
      local_b0 = local_b0 + 1;
    }
  }
  QPainter::~QPainter(local_70);
  QStyleOption::~QStyleOption(local_58);
  return;
}

Assistant:

void
Picker::paintEvent( QPaintEvent * )
{
	QStyleOption opt;
	opt.initFrom( this );

	QPainter p( this );

	drawCylinder( &p, opt.rect, palette().color( QPalette::Dark ) );

	if( count() > 0 )
	{
		if( !d->topItemIndex.isValid() )
		{
			d->topItemIndex = d->model->index( 0, d->modelColumn, d->root );
			d->drawItemOffset = 0;
		}

		d->initDrawOffsetForFirstUse();
		d->normalizeOffset();

		int maxCount = d->itemsCount;

		if( count() >= d->itemsCount )
			++maxCount;

		int offset = d->drawItemOffset;

		for( int i = d->topItemIndex.row(), itemsCount = 0, scanedItems = 0;
			( itemsCount < maxCount ) && ( scanedItems < count() ) ;
			++i, ++scanedItems, ++itemsCount )
		{
			if( i == count() )
				i = 0;

			d->drawItem( &p, opt, offset,
				d->model->index( i, d->modelColumn, d->root ) );

			offset += d->itemTopMargin + d->stringHeight;
		}
	}
}